

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

cmExportBuildFileGenerator * __thiscall
cmGlobalGenerator::GetExportedTargetsFile(cmGlobalGenerator *this,string *filename)

{
  const_iterator cVar1;
  cmExportBuildFileGenerator *pcVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
          ::find(&(this->BuildExportSets)._M_t,filename);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmExportBuildFileGenerator *)0x0;
  }
  else {
    pcVar2 = *(cmExportBuildFileGenerator **)(cVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

cmExportBuildFileGenerator* cmGlobalGenerator::GetExportedTargetsFile(
  const std::string& filename) const
{
  std::map<std::string, cmExportBuildFileGenerator*>::const_iterator it =
    this->BuildExportSets.find(filename);
  return it == this->BuildExportSets.end() ? nullptr : it->second;
}